

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::base::RegisteredHitCounters::validateAfterN
          (RegisteredHitCounters *this,char *filename,LineNumber lineNumber,size_t n)

{
  ulong uVar1;
  HitCounter *pHVar2;
  char *local_28;
  
  local_28 = filename;
  (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe[2])();
  pHVar2 = utils::RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate>::
           get<char_const*,unsigned_long>
                     ((RegistryWithPred<el::base::HitCounter,el::base::HitCounter::Predicate> *)this
                      ,&local_28,lineNumber);
  if (pHVar2 == (HitCounter *)0x0) {
    pHVar2 = (HitCounter *)operator_new(0x20);
    pHVar2->_vptr_HitCounter = (_func_int **)&PTR__HitCounter_00193920;
    pHVar2->m_filename = local_28;
    pHVar2->m_lineNumber = lineNumber;
    pHVar2->m_hitCounts = 0;
    (*(this->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
      super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])(this,pHVar2);
  }
  uVar1 = pHVar2->m_hitCounts;
  if (uVar1 < n) {
    pHVar2->m_hitCounts = uVar1 + 1;
  }
  return n <= uVar1;
}

Assistant:

bool RegisteredHitCounters::validateAfterN(const char* filename, base::type::LineNumber lineNumber, std::size_t n) {
  base::threading::ScopedLock scopedLock(lock());
  base::HitCounter* counter = get(filename, lineNumber);
  if (counter == nullptr) {
    registerNew(counter = new base::HitCounter(filename, lineNumber));
  }
  // Do not use validateHitCounts here since we do not want to reset counter here
  // Note the >= instead of > because we are incrementing
  // after this check
  if (counter->hitCounts() >= n)
    return true;
  counter->increment();
  return false;
}